

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

bool tcu::verifyPointGroupRasterization
               (Surface *surface,PointSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  int i_3;
  int iVar4;
  pointer pSVar5;
  int i;
  long lVar6;
  Vec2 viewportSize;
  Vector<float,_2> res;
  Vec2 pointScreenSpace;
  Vector<float,_2> res_4;
  TriangleSceneSpec triangleScene;
  Vec2 lineQuadNormalizedDeviceSpace [4];
  Vector<float,_2> res_13;
  Vector<float,_2> res_14;
  Vector<float,_2> res_15;
  Vector<float,_2> res_10;
  Vector<float,_2> res_11;
  Vector<float,_2> res_12;
  Vector<float,_2> res_7;
  Vector<float,_2> res_8;
  Vector<float,_2> res_9;
  Vector<float,_2> res_3;
  Vec2 pointNormalizedDeviceSpace;
  float local_118 [6];
  undefined1 *local_100;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_f8;
  float local_d8 [2];
  undefined8 local_d0;
  float local_c8 [2];
  undefined8 local_c0;
  float local_b8 [21];
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  
  local_118[0] = (float)surface->m_width;
  local_118[1] = (float)surface->m_height;
  local_f8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&local_f8,
           ((long)(scene->points).
                  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(scene->points).
                  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x1c71c71c71c71c72);
  pSVar5 = (scene->points).
           super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(scene->points).
                              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) >> 2) *
          0x38e38e39) {
    lVar3 = 0;
    do {
      pSVar5 = pSVar5 + lVar3;
      fVar1 = *(float *)((long)(pSVar5->position).m_data + 0xc);
      local_48 = (pSVar5->position).m_data[0] / fVar1;
      local_44 = *(float *)((long)(pSVar5->position).m_data + 4) / fVar1;
      local_100 = &DAT_3f8000003f800000;
      local_118[2] = 0.0;
      local_118[3] = 0.0;
      lVar6 = 0;
      do {
        local_118[lVar6 + 2] = local_b8[lVar6 + 0x1c] + *(float *)((long)&local_100 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      lVar6 = 0;
      do {
        local_d8[lVar6] = local_118[lVar6 + 2] * 0.5;
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_118[4] = 0.0;
      local_118[5] = 0.0;
      lVar6 = 0;
      do {
        local_118[lVar6 + 4] = local_d8[lVar6] * local_118[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_54 = pSVar5->pointSize * 0.5;
      local_50 = -local_54;
      local_4c = local_50;
      local_b8[0x12] = 0.0;
      local_b8[0x13] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 0x12] = local_118[lVar6 + 4] + local_b8[lVar6 + 0x1a];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_100 = (undefined1 *)0x0;
      lVar6 = 0;
      do {
        *(float *)((long)&local_100 + lVar6 * 4) = local_b8[lVar6 + 0x12] / local_118[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_118[2] = 0.0;
      local_118[3] = 0.0;
      lVar6 = 0;
      do {
        fVar1 = *(float *)((long)&local_100 + lVar6 * 4);
        local_118[lVar6 + 2] = fVar1 + fVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_28 = &DAT_3f8000003f800000;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      lVar6 = 0;
      do {
        local_d8[lVar6] = local_118[lVar6 + 2] - *(float *)((long)&local_28 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_58 = local_50;
      local_b8[0xc] = 0.0;
      local_b8[0xd] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 0xc] = local_118[lVar6 + 4] + local_b8[lVar6 + 0x18];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_b8[0xe] = 0.0;
      local_b8[0xf] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 0xe] = local_b8[lVar6 + 0xc] / local_118[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_b8[0x10] = 0.0;
      local_b8[0x11] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 0x10] = local_b8[lVar6 + 0xe] + local_b8[lVar6 + 0xe];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_30 = &DAT_3f8000003f800000;
      local_d0 = 0;
      lVar6 = 0;
      do {
        *(float *)((long)&local_d0 + lVar6 * 4) =
             local_b8[lVar6 + 0x10] - *(float *)((long)&local_30 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_60 = local_54;
      local_5c = local_54;
      local_b8[6] = 0.0;
      local_b8[7] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 6] = local_118[lVar6 + 4] + local_b8[lVar6 + 0x16];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_b8[8] = 0.0;
      local_b8[9] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 8] = local_b8[lVar6 + 6] / local_118[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_b8[10] = 0.0;
      local_b8[0xb] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 10] = local_b8[lVar6 + 8] + local_b8[lVar6 + 8];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_38 = &DAT_3f8000003f800000;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      lVar6 = 0;
      do {
        local_c8[lVar6] = local_b8[lVar6 + 10] - *(float *)((long)&local_38 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_b8[0x14] = local_54;
      local_64 = local_50;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6] = local_118[lVar6 + 4] + local_b8[lVar6 + 0x14];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_b8[2] = 0.0;
      local_b8[3] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 2] = local_b8[lVar6] / local_118[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_b8[4] = 0.0;
      local_b8[5] = 0.0;
      lVar6 = 0;
      do {
        local_b8[lVar6 + 4] = local_b8[lVar6 + 2] + local_b8[lVar6 + 2];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      local_40 = &DAT_3f8000003f800000;
      local_c0 = 0;
      lVar6 = 0;
      do {
        *(float *)((long)&local_c0 + lVar6 * 4) =
             local_b8[lVar6 + 4] - *(float *)((long)&local_40 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      lVar6 = (lVar3 << 0x21) >> 0x20;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[0].m_data[0] = local_d8[0];
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[0].m_data[1] = local_d8[1];
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[0].m_data[2] = 0.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[0].m_data[3] = 1.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].sharedEdge[0] = false;
      *(undefined8 *)
       local_f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[1].m_data = local_d0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[1].m_data[2] = 0.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[1].m_data[3] = 1.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].sharedEdge[1] = false;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[2].m_data[0] = local_c8[0];
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[2].m_data[1] = local_c8[1];
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[2].m_data[2] = 0.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].positions[2].m_data[3] = 1.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6].sharedEdge[2] = true;
      iVar4 = (int)lVar3 * 2 + 1;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[0].m_data[0] = local_d8[0];
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[0].m_data[1] = local_d8[1];
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[0].m_data[2] = 0.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[0].m_data[3] = 1.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].sharedEdge[0] = true;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[1].m_data[0] = local_c8[0];
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[1].m_data[1] = local_c8[1];
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[1].m_data[2] = 0.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[1].m_data[3] = 1.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].sharedEdge[1] = false;
      *(undefined8 *)
       local_f8.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[2].m_data = local_c0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[2].m_data[2] = 0.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].positions[2].m_data[3] = 1.0;
      local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar4].sharedEdge[2] = false;
      lVar3 = lVar3 + 1;
      pSVar5 = (scene->points).
               super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar3 < (int)((ulong)((long)(scene->points).
                                         super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5)
                          >> 2) * 0x38e38e39);
  }
  bVar2 = verifyTriangleGroupRasterization
                    (surface,(TriangleSceneSpec *)&local_f8,args,log,VERIFICATIONMODE_STRICT);
  if (local_f8.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool verifyPointGroupRasterization (const tcu::Surface& surface, const PointSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	// Splitting to triangles is a valid solution in multisampled cases and even in non-multisample cases too.
	return verifyMultisamplePointGroupRasterization(surface, scene, args, log);
}